

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-circular-array.cc
# Opt level: O1

void __thiscall CircularArrayTest_size_Test::TestBody(CircularArrayTest_size_Test *this)

{
  bool bVar1;
  int line;
  long lVar2;
  char *pcVar3;
  AssertionResult gtest_ar;
  CircularArray<(anonymous_namespace)::TestObject,_2UL> ca;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_60;
  undefined1 local_58 [9];
  undefined7 uStack_4f;
  AssertHelper local_48;
  CircularArray<(anonymous_namespace)::TestObject,_2UL> local_40;
  
  lVar2 = 0;
  do {
    (&local_40.contents_._M_elems[0].moved)[lVar2] = false;
    *(undefined8 *)((long)&local_40.contents_._M_elems[0].data + lVar2) = 0;
    lVar2 = lVar2 + 0xc;
  } while (lVar2 != 0x18);
  (anonymous_namespace)::TestObject::construct_count =
       (anonymous_namespace)::TestObject::construct_count + 2;
  local_40.size_ = 0;
  local_40.front_ = 0;
  local_48.data_._0_4_ = 0;
  local_60.ptr_ = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  testing::internal::CmpHelperEQ<unsigned_int,unsigned_long>
            ((internal *)local_58,"0U","ca.size()",(uint *)&local_48,(unsigned_long *)&local_60);
  if (local_58[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_60);
    if ((undefined8 *)CONCAT71(uStack_4f,local_58[8]) == (undefined8 *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = *(char **)CONCAT71(uStack_4f,local_58[8]);
    }
    line = 0xda;
  }
  else {
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)(local_58 + 8),(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
         );
    local_58._0_4_ = 1;
    local_58._4_4_ = 0;
    local_58[8] = false;
    (anonymous_namespace)::TestObject::construct_count =
         (anonymous_namespace)::TestObject::construct_count + 1;
    wabt::CircularArray<(anonymous_namespace)::TestObject,_2UL>::push_back
              (&local_40,(value_type *)local_58);
    (anonymous_namespace)::TestObject::destruct_count =
         (anonymous_namespace)::TestObject::destruct_count + 1;
    local_48.data_._0_4_ = 1;
    local_60.ptr_ =
         (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_40.size_;
    testing::internal::CmpHelperEQ<unsigned_int,unsigned_long>
              ((internal *)local_58,"1U","ca.size()",(uint *)&local_48,(unsigned_long *)&local_60);
    if (local_58[0] == (internal)0x0) {
      testing::Message::Message((Message *)&local_60);
      if ((undefined8 *)CONCAT71(uStack_4f,local_58[8]) == (undefined8 *)0x0) {
        pcVar3 = "";
      }
      else {
        pcVar3 = *(char **)CONCAT71(uStack_4f,local_58[8]);
      }
      line = 0xdd;
    }
    else {
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)(local_58 + 8),
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      local_58._0_4_ = 2;
      local_58._4_4_ = 0;
      local_58[8] = false;
      (anonymous_namespace)::TestObject::construct_count =
           (anonymous_namespace)::TestObject::construct_count + 1;
      wabt::CircularArray<(anonymous_namespace)::TestObject,_2UL>::push_back
                (&local_40,(value_type *)local_58);
      (anonymous_namespace)::TestObject::destruct_count =
           (anonymous_namespace)::TestObject::destruct_count + 1;
      local_48.data_._0_4_ = 2;
      local_60.ptr_ =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_40.size_
      ;
      testing::internal::CmpHelperEQ<unsigned_int,unsigned_long>
                ((internal *)local_58,"2U","ca.size()",(uint *)&local_48,(unsigned_long *)&local_60)
      ;
      if (local_58[0] == (internal)0x0) {
        testing::Message::Message((Message *)&local_60);
        if ((undefined8 *)CONCAT71(uStack_4f,local_58[8]) == (undefined8 *)0x0) {
          pcVar3 = "";
        }
        else {
          pcVar3 = *(char **)CONCAT71(uStack_4f,local_58[8]);
        }
        line = 0xe0;
      }
      else {
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)(local_58 + 8),
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
        wabt::CircularArray<(anonymous_namespace)::TestObject,_2UL>::pop_back(&local_40);
        local_48.data_._0_4_ = 1;
        local_60.ptr_ =
             (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
             local_40.size_;
        testing::internal::CmpHelperEQ<unsigned_int,unsigned_long>
                  ((internal *)local_58,"1U","ca.size()",(uint *)&local_48,
                   (unsigned_long *)&local_60);
        if (local_58[0] != (internal)0x0) {
          testing::internal::
          scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)(local_58 + 8),
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
          wabt::CircularArray<(anonymous_namespace)::TestObject,_2UL>::pop_back(&local_40);
          local_48.data_._0_4_ = 0;
          local_60.ptr_ =
               (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
               local_40.size_;
          testing::internal::CmpHelperEQ<unsigned_int,unsigned_long>
                    ((internal *)local_58,"0U","ca.size()",(uint *)&local_48,
                     (unsigned_long *)&local_60);
          if (local_58[0] == (internal)0x0) {
            testing::Message::Message((Message *)&local_60);
            if ((undefined8 *)CONCAT71(uStack_4f,local_58[8]) == (undefined8 *)0x0) {
              pcVar3 = "";
            }
            else {
              pcVar3 = *(char **)CONCAT71(uStack_4f,local_58[8]);
            }
            testing::internal::AssertHelper::AssertHelper
                      (&local_48,kFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]wabt/src/test-circular-array.cc"
                       ,0xe6,pcVar3);
            testing::internal::AssertHelper::operator=(&local_48,(Message *)&local_60);
            testing::internal::AssertHelper::~AssertHelper(&local_48);
            if (local_60.ptr_ !=
                (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
              bVar1 = testing::internal::IsTrue(true);
              if ((bVar1) &&
                 (local_60.ptr_ !=
                  (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
                (**(code **)(*(long *)local_60.ptr_ + 8))();
              }
              local_60.ptr_ =
                   (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
            }
          }
          goto LAB_001d7e36;
        }
        testing::Message::Message((Message *)&local_60);
        if ((undefined8 *)CONCAT71(uStack_4f,local_58[8]) == (undefined8 *)0x0) {
          pcVar3 = "";
        }
        else {
          pcVar3 = *(char **)CONCAT71(uStack_4f,local_58[8]);
        }
        line = 0xe3;
      }
    }
  }
  testing::internal::AssertHelper::AssertHelper
            (&local_48,kFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]wabt/src/test-circular-array.cc"
             ,line,pcVar3);
  testing::internal::AssertHelper::operator=(&local_48,(Message *)&local_60);
  testing::internal::AssertHelper::~AssertHelper(&local_48);
  if (local_60.ptr_ !=
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    bVar1 = testing::internal::IsTrue(true);
    if ((bVar1) &&
       (local_60.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
      (**(code **)(*(long *)local_60.ptr_ + 8))();
    }
    local_60.ptr_ = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  }
LAB_001d7e36:
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)(local_58 + 8),(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  wabt::CircularArray<(anonymous_namespace)::TestObject,_2UL>::~CircularArray(&local_40);
  return;
}

Assistant:

TEST_F(CircularArrayTest, size) {
  CircularArray<TestObject, 2> ca;

  ASSERT_EQ(0U, ca.size());

  ca.push_back(TestObject(1));
  ASSERT_EQ(1U, ca.size());

  ca.push_back(TestObject(2));
  ASSERT_EQ(2U, ca.size());

  ca.pop_back();
  ASSERT_EQ(1U, ca.size());

  ca.pop_back();
  ASSERT_EQ(0U, ca.size());
}